

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O0

Buffer * __thiscall rcg::Stream::grab(Stream *this,int64_t _timeout)

{
  GC_ERROR GVar1;
  undefined8 uVar2;
  void *pvVar3;
  element_type *peVar4;
  uint64_t in_RSI;
  long in_RDI;
  GC_ERROR err;
  size_t size;
  EVENT_NEW_BUFFER_DATA data;
  uint64_t timeout;
  lock_guard<std::recursive_mutex> lock;
  shared_ptr<const_rcg::GenTLWrapper> *in_stack_000004d0;
  string *in_stack_000004d8;
  GenTLException *in_stack_000004e0;
  mutex_type *in_stack_fffffffffffffeb8;
  lock_guard<std::recursive_mutex> *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  GenTLException *in_stack_fffffffffffffee0;
  PDSQueueBuffer in_stack_fffffffffffffef8;
  Buffer *in_stack_ffffffffffffff00;
  allocator local_c9;
  string local_c8 [32];
  undefined4 local_a8;
  GC_ERROR local_a4;
  size_t local_a0;
  undefined1 local_92 [16];
  undefined1 local_82;
  allocator local_81;
  string local_80 [35];
  undefined1 local_5d;
  allocator local_49;
  string local_48 [32];
  uint64_t local_28;
  uint64_t local_18;
  Buffer *local_8;
  
  local_18 = in_RSI;
  std::lock_guard<std::recursive_mutex>::lock_guard
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  local_28 = 0xffffffffffffffff;
  if (-1 < (long)local_18) {
    local_28 = local_18;
  }
  if ((*(long *)(in_RDI + 0xe0) != 0) && (*(long *)(in_RDI + 0xd8) != 0)) {
    pvVar3 = Buffer::getHandle((Buffer *)(in_RDI + 0x10));
    if (pvVar3 != (void *)0x0) {
      peVar4 = std::
               __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x12172f);
      in_stack_fffffffffffffef8 = peVar4->DSQueueBuffer;
      in_stack_ffffffffffffff00 = *(Buffer **)(in_RDI + 0xd0);
      pvVar3 = Buffer::getHandle((Buffer *)(in_RDI + 0x10));
      GVar1 = (*in_stack_fffffffffffffef8)(in_stack_ffffffffffffff00,pvVar3);
      if (GVar1 != 0) {
        Buffer::setHandle(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        local_82 = 1;
        uVar2 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_80,"Stream::grab()",&local_81);
        GenTLException::GenTLException(in_stack_000004e0,in_stack_000004d8,in_stack_000004d0);
        local_82 = 0;
        __cxa_throw(uVar2,&GenTLException::typeinfo,GenTLException::~GenTLException);
      }
      Buffer::setHandle(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    }
    local_a0 = 0x10;
    memset(local_92,0,0x10);
    peVar4 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1218de);
    local_a4 = (*peVar4->EventGetData)(*(EVENT_HANDLE *)(in_RDI + 0xd8),local_92,&local_a0,local_28)
    ;
    if ((local_a4 == -0x3f4) || (local_a4 == -0x3f3)) {
      local_8 = (Buffer *)0x0;
    }
    else {
      if (local_a4 != 0) {
        uVar2 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_c8,"Stream::grab()",&local_c9);
        GenTLException::GenTLException(in_stack_000004e0,in_stack_000004d8,in_stack_000004d0);
        __cxa_throw(uVar2,&GenTLException::typeinfo,GenTLException::~GenTLException);
      }
      Buffer::setHandle(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      local_8 = (Buffer *)(in_RDI + 0x10);
    }
    local_a8 = 1;
    std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x121a70)
    ;
    return local_8;
  }
  local_5d = 1;
  uVar2 = __cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"Streaming::grab(): Streaming not started",&local_49);
  GenTLException::GenTLException
            (in_stack_fffffffffffffee0,
             (string *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  local_5d = 0;
  __cxa_throw(uVar2,&GenTLException::typeinfo,GenTLException::~GenTLException);
}

Assistant:

const Buffer *Stream::grab(int64_t _timeout)
{
  std::lock_guard<std::recursive_mutex> lock(mtx);

  uint64_t timeout=GENTL_INFINITE;
  if (_timeout >= 0)
  {
    timeout=static_cast<uint64_t>(_timeout);
  }

  // check that streaming had been started

  if (bn == 0 || event == 0)
  {
    throw GenTLException("Streaming::grab(): Streaming not started");
  }

  // enqueue previously delivered buffer if any

  if (buffer.getHandle() != 0)
  {
    if (gentl->DSQueueBuffer(stream, buffer.getHandle()) != GenTL::GC_ERR_SUCCESS)
    {
      buffer.setHandle(0);
      throw GenTLException("Stream::grab()", gentl);
    }

    buffer.setHandle(0);
  }

  // wait for event

  GenTL::EVENT_NEW_BUFFER_DATA data;
  size_t size=sizeof(GenTL::EVENT_NEW_BUFFER_DATA);
  memset(&data, 0, size);

  GenTL::GC_ERROR err=gentl->EventGetData(event, &data, &size, timeout);

  // return 0 in case of abort and timeout and throw exception in case of
  // another error

  if (err == GenTL::GC_ERR_ABORT || err == GenTL::GC_ERR_TIMEOUT)
  {
    return 0;
  }
  else if (err != GenTL::GC_ERR_SUCCESS)
  {
    throw GenTLException("Stream::grab()", gentl);
  }

  // return buffer

  buffer.setHandle(data.BufferHandle);

  return &buffer;
}